

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.cpp
# Opt level: O2

void __thiscall wasm::Thread::work(Thread *this,function<wasm::ThreadWorkState_()> *doWork_)

{
  std::mutex::lock(&this->mutex);
  std::function<wasm::ThreadWorkState_()>::operator=(&this->doWork,doWork_);
  std::condition_variable::notify_one();
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
  return;
}

Assistant:

void Thread::work(std::function<ThreadWorkState()> doWork_) {
  // TODO: fancy work stealing
  DEBUG_THREAD("send work to thread\n");
  {
    std::lock_guard<std::mutex> lock(mutex);
    // notify the thread that it can do some work
    doWork = doWork_;
    condition.notify_one();
    DEBUG_THREAD("work sent\n");
  }
}